

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O2

unique_ptr<mp::FlatModelInfo,_std::default_delete<mp::FlatModelInfo>_> mp::CreateFlatModelInfo(void)

{
  FlatModelInfoImpl *this;
  __uniq_ptr_data<mp::FlatModelInfo,_std::default_delete<mp::FlatModelInfo>,_true,_true> in_RDI;
  
  this = (FlatModelInfoImpl *)operator_new(0xd0);
  memset(this,0,0xd0);
  FlatModelInfoImpl::FlatModelInfoImpl(this);
  *(FlatModelInfoImpl **)
   in_RDI.super___uniq_ptr_impl<mp::FlatModelInfo,_std::default_delete<mp::FlatModelInfo>_>._M_t.
   super__Tuple_impl<0UL,_mp::FlatModelInfo_*,_std::default_delete<mp::FlatModelInfo>_>.
   super__Head_base<0UL,_mp::FlatModelInfo_*,_false>._M_head_impl = this;
  return (__uniq_ptr_data<mp::FlatModelInfo,_std::default_delete<mp::FlatModelInfo>,_true,_true>)
         (tuple<mp::FlatModelInfo_*,_std::default_delete<mp::FlatModelInfo>_>)
         in_RDI.super___uniq_ptr_impl<mp::FlatModelInfo,_std::default_delete<mp::FlatModelInfo>_>.
         _M_t.super__Tuple_impl<0UL,_mp::FlatModelInfo_*,_std::default_delete<mp::FlatModelInfo>_>.
         super__Head_base<0UL,_mp::FlatModelInfo_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<FlatModelInfo> CreateFlatModelInfo() {
  return std::unique_ptr<FlatModelInfo>{new FlatModelInfoImpl()};
}